

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O1

uint32_t helper_neon_narrow_sat_u16_aarch64(CPUARMState_conflict *env,uint64_t x)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = (uint)x;
  if (0xffff < uVar1) {
    (env->vfp).qc[0] = 1;
    uVar1 = 0xffff;
  }
  if (x >> 0x30 == 0) {
    iVar2 = (int)(x >> 0x20);
  }
  else {
    (env->vfp).qc[0] = 1;
    iVar2 = 0xffff;
  }
  return iVar2 << 0x10 | uVar1;
}

Assistant:

uint32_t HELPER(neon_narrow_sat_u16)(CPUARMState *env, uint64_t x)
{
    uint32_t high;
    uint32_t low;
    low = x;
    if (low > 0xffff) {
        low = 0xffff;
        SET_QC();
    }
    high = x >> 32;
    if (high > 0xffff) {
        high = 0xffff;
        SET_QC();
    }
    return low | (high << 16);
}